

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

Benchmark * __thiscall benchmark::internal::Benchmark::Arg(Benchmark *this,int x)

{
  pointer pvVar1;
  ulong uVar2;
  CheckHandler CStack_18;
  
  pvVar1 = (this->imp_->args_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((pvVar1 != (this->imp_->args_).
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) &&
      (uVar2 = (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start & 0x3fffffffc, uVar2 != 0x3fffffffc)) &&
     (uVar2 != 4)) {
    CheckHandler::CheckHandler
              (&CStack_18,"imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
               ,"Arg",0x2a2);
    CheckHandler::~CheckHandler(&CStack_18);
  }
  GetNullLogInstance();
  BenchmarkImp::Arg(this->imp_,x);
  return this;
}

Assistant:

Benchmark* Benchmark::Arg(int x) {
  CHECK(imp_->ArgsCnt() == -1 || imp_->ArgsCnt() == 1);
  imp_->Arg(x);
  return this;
}